

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O3

int ffprwu(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  int colnum;
  int nullstatus;
  int ncols;
  LONGLONG ntotrows;
  int local_54;
  int local_50;
  int local_4c;
  LONGLONG local_48;
  LONGLONG local_40;
  long local_38;
  
  if (0 < *status) {
    return *status;
  }
  if ((firstrow < 1 || nrows < 1) ||
     (ffgnrwll(fptr,&local_38,status), local_38 < firstrow + nrows + -1)) {
    *status = 0x133;
    return 0x133;
  }
  ffgncl(fptr,&local_4c,status);
  if (*status != 0) {
    return *status;
  }
  if (0 < local_4c) {
    colnum = 0;
    while( true ) {
      colnum = colnum + 1;
      local_48 = 0;
      local_50 = 0;
      local_40 = 0;
      ffgtclll(fptr,colnum,&local_50,&local_48,&local_40,status);
      if (*status != 0) {
        return *status;
      }
      if (local_50 == 0x10) {
        local_48 = local_48 / local_40;
      }
      local_54 = 0;
      ffpclu(fptr,colnum,firstrow,1,local_48 * nrows,&local_54);
      if ((local_54 != 0) && (local_54 != 0x13a)) break;
      if (local_4c <= colnum) {
        return *status;
      }
    }
    *status = local_54;
    return local_54;
  }
  return 0;
}

Assistant:

int ffprwu(fitsfile *fptr,
           LONGLONG firstrow,
           LONGLONG nrows, 
           int *status)

/* 
 * fits_write_nullrows / ffprwu - write TNULLs to all columns in one or more rows
 *
 * fitsfile *fptr - pointer to FITS HDU opened for read/write
 * long int firstrow - first table row to set to null. (firstrow >= 1)
 * long int nrows - total number or rows to set to null. (nrows >= 1)
 * int *status - upon return, *status contains CFITSIO status code
 *
 * RETURNS: CFITSIO status code
 *
 * written by Craig Markwardt, GSFC 
 */
{
  LONGLONG ntotrows;
  int ncols, i;
  int typecode = 0;
  LONGLONG repeat = 0, width = 0;
  int nullstatus;

  if (*status > 0) return *status;

  if ((firstrow <= 0) || (nrows <= 0)) return (*status = BAD_ROW_NUM);

  fits_get_num_rowsll(fptr, &ntotrows, status);

  if (firstrow + nrows - 1 > ntotrows) return (*status = BAD_ROW_NUM);
  
  fits_get_num_cols(fptr, &ncols, status);
  if (*status) return *status;


  /* Loop through each column and write nulls */
  for (i=1; i <= ncols; i++) {
    repeat = 0;  typecode = 0;  width = 0;
    fits_get_coltypell(fptr, i, &typecode, &repeat, &width, status);
    if (*status) break;

    /* NOTE: data of TSTRING type must not write the total repeat
       count, since the repeat count is the *character* count, not the
       nstring count.  Divide by string width to get number of
       strings. */
    
    if (typecode == TSTRING) repeat /= width;

    /* Write NULLs */
    nullstatus = 0;
    fits_write_col_null(fptr, i, firstrow, 1, repeat*nrows, &nullstatus);

    /* ignore error if no null value is defined for the column */
    if (nullstatus && nullstatus != NO_NULL) return (*status = nullstatus);
    
  }
    
  return *status;
}